

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndFrame(void)

{
  ImVector<ImGuiWindow_*> *this;
  ImVec2 IVar1;
  _func_void_int_int *p_Var2;
  char *text;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  int iVar9;
  ImVec2 in_RAX;
  ImGuiContext *g;
  ImGuiWindow *pIVar10;
  char *pcVar11;
  byte bVar12;
  byte bVar13;
  char *label;
  ulong uVar14;
  int i;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  p_Var2 = (GImGui->IO).ImeSetInputScreenPosFn;
  local_38 = in_RAX;
  if (p_Var2 != (_func_void_int_int *)0x0) {
    fVar15 = (GImGui->PlatformImePos).x;
    fVar16 = (GImGui->PlatformImePos).y;
    fVar17 = (GImGui->PlatformImeLastPos).x - fVar15;
    fVar18 = (GImGui->PlatformImeLastPos).y - fVar16;
    if (0.0001 < fVar17 * fVar17 + fVar18 * fVar18) {
      (*p_Var2)((int)fVar15,(int)fVar16);
      pIVar6->PlatformImeLastPos = pIVar6->PlatformImePos;
    }
  }
  iVar9 = (pIVar6->CurrentWindowStack).Size;
  if (1 < iVar9) {
    while (1 < iVar9) {
      End();
      iVar9 = (pIVar6->CurrentWindowStack).Size;
    }
  }
  pIVar6->FrameScopePushedImplicitWindow = false;
  pIVar10 = pIVar6->CurrentWindow;
  if ((pIVar10 != (ImGuiWindow *)0x0) && (pIVar10->WriteAccessed == false)) {
    pIVar10->Active = false;
  }
  End();
  pIVar7 = GImGui;
  if ((pIVar6->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingList == (ImGuiWindow *)0x0) {
      pIVar10 = FindWindowByName("###NavWindowingList");
      pIVar7->NavWindowingList = pIVar10;
    }
    pIVar5 = GImGui;
    (GImGui->NextWindowData).SizeConstraintCond = 1;
    IVar1 = (pIVar7->IO).DisplaySize;
    IVar3.y = IVar1.y * 0.2;
    IVar3.x = IVar1.x * 0.2;
    (pIVar5->NextWindowData).SizeConstraintRect.Min = IVar3;
    (pIVar5->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar5->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar5->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar5->NextWindowData).SizeCallbackUserData = (void *)0x0;
    IVar1 = (pIVar7->IO).DisplaySize;
    IVar4.y = IVar1.y * 0.5;
    IVar4.x = IVar1.x * 0.5;
    (pIVar5->NextWindowData).PosVal = IVar4;
    (pIVar5->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar5->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar5->NextWindowData).PosCond = 1;
    IVar1 = (pIVar7->Style).WindowPadding;
    fVar15 = IVar1.x;
    fVar16 = IVar1.y;
    local_38.y = fVar16 + fVar16;
    local_38.x = fVar15 + fVar15;
    PushStyleVar(1,&local_38);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    for (uVar14 = (ulong)(uint)(pIVar7->WindowsFocusOrder).Size; 0 < (int)uVar14;
        uVar14 = uVar14 - 1) {
      pIVar10 = (pIVar7->WindowsFocusOrder).Data[uVar14 - 1];
      bVar8 = IsWindowNavFocusable(pIVar10);
      if (bVar8) {
        text = pIVar10->Name;
        pcVar11 = FindRenderedTextEnd(text,(char *)0x0);
        label = text;
        if (text == pcVar11) {
          label = "(Popup)";
          if (((uint)pIVar10->Flags >> 0x1a & 1) == 0) {
            if (((uint)pIVar10->Flags >> 10 & 1) != 0) {
              iVar9 = strcmp(text,"##MainMenuBar");
              label = "(Main menu bar)";
              if (iVar9 == 0) goto LAB_00124153;
            }
            label = "(Untitled)";
          }
        }
LAB_00124153:
        local_38.x = 0.0;
        local_38.y = 0.0;
        Selectable(label,pIVar7->NavWindowingTarget == pIVar10,0,&local_38);
      }
    }
    End();
    PopStyleVar(1);
  }
  bVar12 = pIVar6->DragDropActive;
  iVar9 = pIVar6->FrameCount;
  if ((bool)bVar12 != true) goto LAB_001241ef;
  if ((pIVar6->DragDropPayload).DataFrameCount + 1 < iVar9) {
    if ((pIVar6->DragDropSourceFlags & 0x20) == 0) {
      bVar13 = (GImGui->IO).MouseDown[pIVar6->DragDropMouseButton] ^ 1;
      goto LAB_001241d3;
    }
  }
  else {
    bVar13 = 0;
LAB_001241d3:
    if ((bVar13 == 0) && ((pIVar6->DragDropPayload).Delivery == false)) goto LAB_001241ef;
  }
  ClearDragDrop();
  bVar12 = pIVar6->DragDropActive;
  iVar9 = pIVar6->FrameCount;
LAB_001241ef:
  if (((bVar12 & 1) != 0) && (pIVar6->DragDropSourceFrameCount < iVar9)) {
    pIVar6->DragDropWithinSourceOrTarget = true;
    SetTooltip("...");
    pIVar6->DragDropWithinSourceOrTarget = false;
    iVar9 = pIVar6->FrameCount;
  }
  pIVar6->FrameScopeActive = false;
  pIVar6->FrameCountEnded = iVar9;
  UpdateMouseMovingWindowEndFrame();
  this = &pIVar6->WindowsSortBuffer;
  ImVector<ImGuiWindow_*>::resize(this,0);
  ImVector<ImGuiWindow_*>::reserve(this,(pIVar6->Windows).Size);
  for (uVar14 = 0; uVar14 != (uint)(pIVar6->Windows).Size; uVar14 = uVar14 + 1) {
    pIVar10 = (pIVar6->Windows).Data[uVar14];
    if ((pIVar10->Active != true) || ((pIVar10->Flags & 0x1000000) == 0)) {
      AddWindowToSortBuffer(this,pIVar10);
    }
  }
  ImVector<ImGuiWindow_*>::swap(&pIVar6->Windows,this);
  (pIVar6->IO).MetricsActiveWindows = pIVar6->WindowsActiveCount;
  ((pIVar6->IO).Fonts)->Locked = false;
  (pIVar6->IO).MouseWheel = 0.0;
  (pIVar6->IO).MouseWheelH = 0.0;
  ImVector<unsigned_short>::resize(&(pIVar6->IO).InputQueueCharacters,0);
  (pIVar6->IO).NavInputs[0x10] = 0.0;
  (pIVar6->IO).NavInputs[0x11] = 0.0;
  (pIVar6->IO).NavInputs[0x12] = 0.0;
  (pIVar6->IO).NavInputs[0x13] = 0.0;
  (pIVar6->IO).NavInputs[0xc] = 0.0;
  (pIVar6->IO).NavInputs[0xd] = 0.0;
  (pIVar6->IO).NavInputs[0xe] = 0.0;
  (pIVar6->IO).NavInputs[0xf] = 0.0;
  (pIVar6->IO).NavInputs[8] = 0.0;
  (pIVar6->IO).NavInputs[9] = 0.0;
  (pIVar6->IO).NavInputs[10] = 0.0;
  (pIVar6->IO).NavInputs[0xb] = 0.0;
  (pIVar6->IO).NavInputs[4] = 0.0;
  (pIVar6->IO).NavInputs[5] = 0.0;
  (pIVar6->IO).NavInputs[6] = 0.0;
  (pIVar6->IO).NavInputs[7] = 0.0;
  (pIVar6->IO).NavInputs[0] = 0.0;
  (pIVar6->IO).NavInputs[1] = 0.0;
  (pIVar6->IO).NavInputs[2] = 0.0;
  (pIVar6->IO).NavInputs[3] = 0.0;
  (pIVar6->IO).NavInputs[0x14] = 0.0;
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;
    IM_ASSERT(g.FrameScopeActive && "Forgot to call ImGui::NewFrame()?");

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f)
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Report when there is a mismatch of Begin/BeginChild vs End/EndChild calls. Important: Remember that the Begin/BeginChild API requires you
    // to always call End/EndChild even if Begin/BeginChild returns false! (this is unfortunately inconsistent with most other Begin* API).
    if (g.CurrentWindowStack.Size != 1)
    {
        if (g.CurrentWindowStack.Size > 1)
        {
            IM_ASSERT(g.CurrentWindowStack.Size == 1 && "Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?");
            while (g.CurrentWindowStack.Size > 1) // FIXME-ERRORHANDLING
                End();
        }
        else
        {
            IM_ASSERT(g.CurrentWindowStack.Size == 1 && "Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?");
        }
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.FrameScopePushedImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Show CTRL+TAB list window
    if (g.NavWindowingTarget)
        NavUpdateWindowingList();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount)
    {
        g.DragDropWithinSourceOrTarget = true;
        SetTooltip("...");
        g.DragDropWithinSourceOrTarget = false;
    }

    // End frame
    g.FrameScopeActive = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsSortBuffer, window);
    }

    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);  // we done something wrong
    g.Windows.swap(g.WindowsSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}